

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KInstPrinter.c
# Opt level: O0

char * M68K_reg_name(csh handle,uint reg)

{
  uint reg_local;
  csh handle_local;
  char *local_8;
  
  if (reg < 0x2f) {
    local_8 = s_reg_names[(int)reg];
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* M68K_reg_name(csh handle, unsigned int reg)
{
#ifdef CAPSTONE_DIET
	return NULL;
#else
	if (reg >= ARR_SIZE(s_reg_names)) {
		return NULL;
	}
	return s_reg_names[(int)reg];
#endif
}